

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

bool __thiscall reflection::SchemaFile::Verify(SchemaFile *this,Verifier *verifier)

{
  bool bVar1;
  String *str;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar2;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    str = filename(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6), bVar1
       )) {
      pVVar2 = included_filenames(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::
              VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>(verifier,pVVar2);
      if (bVar1) {
        pVVar2 = included_filenames(this);
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,pVVar2);
        if (bVar1) {
          verifier->depth_ = verifier->depth_ - 1;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_FILENAME) &&
           verifier.VerifyString(filename()) &&
           VerifyOffset(verifier, VT_INCLUDED_FILENAMES) &&
           verifier.VerifyVector(included_filenames()) &&
           verifier.VerifyVectorOfStrings(included_filenames()) &&
           verifier.EndTable();
  }